

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
BuildTokenTestDoNotStartWithoutToken::~BuildTokenTestDoNotStartWithoutToken
          (BuildTokenTestDoNotStartWithoutToken *this)

{
  BuildTokenTest::~BuildTokenTest(&this->super_BuildTokenTest);
  operator_delete(this,0x510);
  return;
}

Assistant:

TEST_F(BuildTokenTest, DoNotStartWithoutToken) {
  // plan should execute one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat1", &err));
  ASSERT_EQ("", err);

  // we could run a command but do not have a token for it
  ExpectCanRunMore(1,   true);
  ExpectAcquireToken(1, false);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("stuck [this is a bug]", err);

  EXPECT_EQ(0u, token_command_runner_.commands_ran_.size());
}